

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

bool __thiscall spv::Builder::containsPhysicalStorageBufferOrArray(Builder *this,Id typeId)

{
  Op OVar1;
  Instruction *this_00;
  bool bVar2;
  int iVar3;
  Id IVar4;
  int iVar5;
  StorageClass SVar6;
  bool bVar7;
  
  while( true ) {
    this_00 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start[typeId];
    OVar1 = this_00->opCode;
    if (OVar1 != OpTypeArray) break;
    typeId = getContainedTypeId(this,typeId,0);
  }
  if (OVar1 == OpTypePointer) {
    SVar6 = Module::getStorageClass(&this->module,typeId);
    bVar7 = SVar6 == PhysicalStorageBuffer;
  }
  else if (OVar1 == OpTypeStruct) {
    iVar3 = Instruction::getNumOperands(this_00);
    bVar7 = 0 < iVar3;
    if (0 < iVar3) {
      IVar4 = Instruction::getIdOperand(this_00,0);
      bVar2 = containsPhysicalStorageBufferOrArray(this,IVar4);
      if (!bVar2) {
        iVar3 = 1;
        do {
          iVar5 = Instruction::getNumOperands(this_00);
          bVar7 = iVar3 < iVar5;
          if (iVar5 <= iVar3) {
            return bVar7;
          }
          IVar4 = Instruction::getIdOperand(this_00,iVar3);
          bVar2 = containsPhysicalStorageBufferOrArray(this,IVar4);
          iVar3 = iVar3 + 1;
        } while (!bVar2);
      }
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool Builder::containsPhysicalStorageBufferOrArray(Id typeId) const
{
    const Instruction& instr = *module.getInstruction(typeId);

    Op typeClass = instr.getOpCode();
    switch (typeClass)
    {
    case OpTypePointer:
        return getTypeStorageClass(typeId) == StorageClassPhysicalStorageBufferEXT;
    case OpTypeArray:
        return containsPhysicalStorageBufferOrArray(getContainedTypeId(typeId));
    case OpTypeStruct:
        for (int m = 0; m < instr.getNumOperands(); ++m) {
            if (containsPhysicalStorageBufferOrArray(instr.getIdOperand(m)))
                return true;
        }
        return false;
    default:
        return false;
    }
}